

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

bool NumberTemp::IsTempProducing(Instr *instr)

{
  OpCode opcode;
  Opnd *this;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ObjectType OVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  undefined8 uStack_28;
  ValueType baseValueType;
  
  opcode = instr->m_opcode;
  uStack_28 = in_RAX;
  bVar2 = OpCodeAttr::TempNumberProducing(opcode);
  if (bVar2) {
    return true;
  }
  if (opcode == LdElemI_A) {
    this = instr->m_src1;
    OVar3 = IR::Opnd::GetKind(this);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uStack_28 = CONCAT26(*(undefined2 *)(this[1]._vptr_Opnd + 1),(undefined6)uStack_28);
    bVar2 = ValueType::IsLikelyObject((ValueType *)((long)&uStack_28 + 6));
    if (bVar2) {
      OVar4 = ValueType::GetObjectType((ValueType *)((long)&uStack_28 + 6));
      if (OVar4 == Float32Array) {
        return true;
      }
      OVar4 = ValueType::GetObjectType((ValueType *)((long)&uStack_28 + 6));
      if (OVar4 == Float64Array) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempProducing(IR::Instr * instr)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::TempNumberProducing(opcode))
    {
        return true;
    }

    // Loads from float typedArrays usually require a conversion to Var, which we can MarkTemp.
    if (opcode == Js::OpCode::LdElemI_A)
    {
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if (baseValueType.IsLikelyObject()
            && (baseValueType.GetObjectType() == ObjectType::Float32Array
            || baseValueType.GetObjectType() == ObjectType::Float64Array))
        {
            return true;
        }
    }

    return false;
}